

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes2ts.h
# Opt level: O3

void __thiscall libwebm::VpxPes2Ts::~VpxPes2Ts(VpxPes2Ts *this)

{
  pointer puVar1;
  FILE *__stream;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__VpxPes2Ts_00124b38;
  puVar1 = (this->ts_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  std::unique_ptr<libwebm::Webm2Pes,_std::default_delete<libwebm::Webm2Pes>_>::~unique_ptr
            (&this->pes_converter_);
  __stream = (FILE *)(this->output_file_)._M_t.super___uniq_ptr_impl<_IO_FILE,_libwebm::FILEDeleter>
                     ._M_t.super__Tuple_impl<0UL,__IO_FILE_*,_libwebm::FILEDeleter>.
                     super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  (this->output_file_)._M_t.super___uniq_ptr_impl<_IO_FILE,_libwebm::FILEDeleter>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_libwebm::FILEDeleter>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (_IO_FILE *)0x0;
  pcVar2 = (this->output_file_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->output_file_name_).field_2) {
    operator_delete(pcVar2);
  }
  pcVar2 = (this->input_file_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->input_file_name_).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

virtual ~VpxPes2Ts() = default;